

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_signal.c
# Opt level: O2

void block_signal(int sig,_Bool block_it)

{
  int iVar1;
  sigset_t ss;
  
  sigemptyset((sigset_t *)&ss);
  sigaddset((sigset_t *)&ss,sig);
  iVar1 = sigprocmask((uint)!block_it,(sigset_t *)&ss,(sigset_t *)0x0);
  if (-1 < iVar1) {
    return;
  }
  perror("sigprocmask");
  exit(1);
}

Assistant:

void block_signal(int sig, bool block_it)
{
    sigset_t ss;

    sigemptyset(&ss);
    sigaddset(&ss, sig);
    if(sigprocmask(block_it ? SIG_BLOCK : SIG_UNBLOCK, &ss, 0) < 0) {
        perror("sigprocmask");
        exit(1);
    }
}